

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

void Eigen::internal::
     conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
     ::run(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *_this,Index rows,Index cols)

{
  double *__ptr;
  Index IVar1;
  Index IVar2;
  Matrix<double,__1,__1,_0,__1,__1> local_b0;
  Index local_98;
  Index local_90;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_88;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_50;
  
  local_98 = cols;
  local_90 = rows;
  if (*(long *)(_this + 8) == rows) {
    if (*(long *)(_this + 0x10) != cols) {
      if ((cols != 0 && rows != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(cols),0) < rows)) {
        throw_std_bad_alloc();
      }
      DenseStorage<double,_-1,_-1,_-1,_0>::conservativeResize
                ((DenseStorage<double,__1,__1,__1,_0> *)_this,cols * rows,rows,cols);
      return;
    }
  }
  else {
    Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_b0,&local_90,&local_98);
    IVar1 = local_90;
    if (*(long *)(_this + 8) < local_90) {
      IVar1 = *(long *)(_this + 8);
    }
    IVar2 = local_98;
    if (*(long *)(_this + 0x10) < local_98) {
      IVar2 = *(long *)(_this + 0x10);
    }
    Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
              (&local_50,(Matrix<double,__1,__1,_0,__1,__1> *)_this,0,0,IVar1,IVar2);
    Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
              (&local_88,&local_b0,0,0,IVar1,IVar2);
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
              (&local_88,&local_50);
    __ptr = *(double **)_this;
    *(double **)_this =
         local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
    IVar1 = *(Index *)(_this + 8);
    IVar2 = *(Index *)(_this + 0x10);
    *(Index *)(_this + 8) =
         local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    *(Index *)(_this + 0x10) =
         local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
    local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         __ptr;
    local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         IVar1;
    local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         IVar2;
    free(__ptr);
  }
  return;
}

Assistant:

static void run(DenseBase<Derived>& _this, Index rows, Index cols)
  {
    if (_this.rows() == rows && _this.cols() == cols) return;
    EIGEN_STATIC_ASSERT_DYNAMIC_SIZE(Derived)

    if ( ( Derived::IsRowMajor && _this.cols() == cols) || // row-major and we change only the number of rows
         (!Derived::IsRowMajor && _this.rows() == rows) )  // column-major and we change only the number of columns
    {
      internal::check_rows_cols_for_overflow<Derived::MaxSizeAtCompileTime>::run(rows, cols);
      _this.derived().m_storage.conservativeResize(rows*cols,rows,cols);
    }
    else
    {
      // The storage order does not allow us to use reallocation.
      typename Derived::PlainObject tmp(rows,cols);
      const Index common_rows = numext::mini(rows, _this.rows());
      const Index common_cols = numext::mini(cols, _this.cols());
      tmp.block(0,0,common_rows,common_cols) = _this.block(0,0,common_rows,common_cols);
      _this.derived().swap(tmp);
    }
  }